

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_vector.h
# Opt level: O0

void __thiscall
lzham::vector<lzham::lzcompressor::lzpriced_decision>::clear
          (vector<lzham::lzcompressor::lzpriced_decision> *this)

{
  long lVar1;
  void *extraout_RDX;
  lzpriced_decision *in_RDI;
  uint in_stack_ffffffffffffffec;
  
  lVar1._0_4_ = (in_RDI->super_lzdecision).m_pos;
  lVar1._4_4_ = (in_RDI->super_lzdecision).m_len;
  if (lVar1 != 0) {
    scalar_type<lzham::lzcompressor::lzpriced_decision>::destruct_array
              (in_RDI,in_stack_ffffffffffffffec);
    lzham::lzham_free((lzham *)in_RDI->m_cost,*(void **)&in_RDI->super_lzdecision,extraout_RDX);
    (in_RDI->super_lzdecision).m_pos = 0;
    (in_RDI->super_lzdecision).m_len = 0;
    (in_RDI->super_lzdecision).m_dist = 0;
    *(undefined4 *)&in_RDI->field_0xc = 0;
  }
  return;
}

Assistant:

inline void clear()
      {
         if (m_p)
         {
            scalar_type<T>::destruct_array(m_p, m_size);
            lzham_free(m_malloc_context, m_p);
            m_p = NULL;
            m_size = 0;
            m_capacity = 0;
         }
      }